

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_color_ez(rf_image *__return_storage_ptr__,int width,int height,rf_color color)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  uVar5 = height * width;
  pvVar2 = malloc((long)(int)(uVar5 * 4));
  auVar1 = _DAT_00177b60;
  if (pvVar2 != (void *)0x0) {
    if (0 < (int)uVar5) {
      lVar3 = (ulong)uVar5 - 1;
      auVar6._8_4_ = (int)lVar3;
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar4 = 0;
      auVar6 = auVar6 ^ _DAT_00177b60;
      auVar8 = _DAT_00177d50;
      auVar9 = _DAT_00177d60;
      do {
        auVar10 = auVar9 ^ auVar1;
        iVar7 = auVar6._4_4_;
        if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_
                    ) & 1)) {
          *(rf_color *)((long)pvVar2 + uVar4 * 4) = color;
        }
        if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
            auVar10._12_4_ <= auVar6._12_4_) {
          *(rf_color *)((long)pvVar2 + uVar4 * 4 + 4) = color;
        }
        auVar10 = auVar8 ^ auVar1;
        iVar11 = auVar10._4_4_;
        if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
          *(rf_color *)((long)pvVar2 + uVar4 * 4 + 8) = color;
          *(rf_color *)((long)pvVar2 + uVar4 * 4 + 0xc) = color;
        }
        uVar4 = uVar4 + 4;
        lVar3 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar3 + 4;
        lVar3 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 4;
        auVar8._8_8_ = lVar3 + 4;
      } while ((uVar5 + 3 & 0xfffffffc) != uVar4);
    }
    __return_storage_ptr__->data = pvVar2;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color_ez(int width, int height, rf_color color) { return rf_gen_image_color(width, height, color, RF_DEFAULT_ALLOCATOR); }